

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

Alignment __thiscall QCss::Declaration::alignmentValue(Declaration *this)

{
  bool bVar1;
  int value;
  Int IVar2;
  DeclarationData *pDVar3;
  qsizetype qVar4;
  const_pointer this_00;
  long in_FS_OFFSET;
  Alignment v;
  QFlags<Qt::AlignmentFlag> *in_stack_ffffffffffffffa8;
  enum_type in_stack_ffffffffffffffb0;
  QFlag in_stack_ffffffffffffffb4;
  QFlag in_stack_ffffffffffffffd0;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_ffffffffffffffd4;
  undefined4 uVar5;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2e4ba);
  bVar1 = ::QVariant::isValid((QVariant *)
                              CONCAT44(in_stack_ffffffffffffffb4.i,in_stack_ffffffffffffffb0));
  if (bVar1) {
    pDVar3 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2e4d6
                       );
    value = ::QVariant::toInt((bool *)&pDVar3->parsed);
    QFlag::QFlag((QFlag *)&stack0xffffffffffffffd0,value);
    QFlags<Qt::AlignmentFlag>::QFlagsStorageHelper
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb4);
  }
  else {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2e50f);
    bVar1 = QList<QCss::Value>::isEmpty((QList<QCss::Value> *)0xa2e51b);
    if (!bVar1) {
      pDVar3 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                         ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                          0xa2e529);
      qVar4 = QList<QCss::Value>::size(&pDVar3->values);
      if (qVar4 < 3) {
        uVar5 = 0xaaaaaaaa;
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2e567);
        this_00 = QList<QCss::Value>::constData((QList<QCss::Value> *)0xa2e573);
        pDVar3 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                           ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                            0xa2e582);
        QList<QCss::Value>::size(&pDVar3->values);
        in_stack_ffffffffffffffd4.i =
             (Int)parseAlignment((Value *)CONCAT44(uVar5,in_stack_ffffffffffffffd0.i),this._4_4_);
        IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffffd4);
        ::QVariant::QVariant(&local_28,IVar2);
        QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                  ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2e5be);
        ::QVariant::operator=
                  ((QVariant *)this_00,
                   (QVariant *)CONCAT44(in_stack_ffffffffffffffb4.i,in_stack_ffffffffffffffb0));
        ::QVariant::~QVariant(&local_28);
        goto LAB_00a2e5d9;
      }
    }
    in_stack_ffffffffffffffd4.i =
         (Int)Qt::operator|(in_stack_ffffffffffffffb4.i,in_stack_ffffffffffffffb0);
  }
LAB_00a2e5d9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
           (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)in_stack_ffffffffffffffd4.i;
  }
  __stack_chk_fail();
}

Assistant:

Qt::Alignment Declaration::alignmentValue() const
{
    if (d->parsed.isValid())
        return Qt::Alignment(d->parsed.toInt());
    if (d->values.isEmpty() || d->values.size() > 2)
        return Qt::AlignLeft | Qt::AlignTop;

    Qt::Alignment v = parseAlignment(d->values.constData(), d->values.size());
    d->parsed = int(v);
    return v;
}